

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_ptr vfp_reg_ptr(TCGContext_conflict1 *tcg_ctx,_Bool dp,int reg)

{
  TCGTemp *pTVar1;
  undefined7 in_register_00000031;
  
  pTVar1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)((long)pTVar1 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
             ((CONCAT71(in_register_00000031,dp) & 0xffffffff) >> 1) * 0x100 +
             (ulong)((uint)CONCAT71(in_register_00000031,dp) & 1) * 8 + 0xc10);
  return (TCGv_ptr)((long)pTVar1 - (long)tcg_ctx);
}

Assistant:

static TCGv_ptr vfp_reg_ptr(TCGContext *tcg_ctx, bool dp, int reg)
{
    TCGv_ptr ret = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, ret, tcg_ctx->cpu_env, vfp_reg_offset(dp, reg));
    return ret;
}